

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O2

_Bool i2p_dsa_verify(uint8_t *pubkey,uint8_t *buf,size_t sz,uint8_t *sig)

{
  int iVar1;
  DSA *dsa;
  BIGNUM *pBVar2;
  DSA_SIG *sig_00;
  BIGNUM *pBVar3;
  uint8_t digest [20];
  
  dsa = (DSA *)new_DSA();
  pBVar2 = BN_bin2bn(pubkey,0x80,(BIGNUM *)0x0);
  DSA_set0_key(dsa,pBVar2,0);
  SHA1(buf,sz,digest);
  sig_00 = DSA_SIG_new();
  pBVar2 = BN_bin2bn(sig,10,(BIGNUM *)0x0);
  pBVar3 = BN_bin2bn(sig + 10,10,(BIGNUM *)0x0);
  DSA_SIG_set0(sig_00,pBVar2,pBVar3);
  iVar1 = DSA_do_verify(digest,0x14,sig_00,dsa);
  DSA_SIG_free(sig_00);
  DSA_free(dsa);
  return iVar1 == 1;
}

Assistant:

bool i2p_dsa_verify(const uint8_t * pubkey, const uint8_t * buf, size_t sz, const uint8_t * sig)
{
  DSA * pk = new_DSA();
  DSA_set0_key(pk, BN_bin2bn (pubkey, 128, NULL), NULL);
  uint8_t digest[20];
  SHA1(buf, sz, digest);
  DSA_SIG * s = DSA_SIG_new();
  DSA_SIG_set0 (s, BN_bin2bn (sig, 10, NULL), BN_bin2bn (sig + 10, 10, NULL));
  int ret = DSA_do_verify(digest, 20, s, pk);
  DSA_SIG_free(s);
  DSA_free(pk);
  return ret == 1;
}